

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ms_gauden.c
# Opt level: O1

void gauden_free(gauden_t *g)

{
  mfcc_t ****ppppmVar1;
  
  if (g != (gauden_t *)0x0) {
    ppppmVar1 = g->mean;
    if (ppppmVar1 != (mfcc_t ****)0x0) {
      ckd_free(***ppppmVar1);
      ckd_free_3d(ppppmVar1);
    }
    ppppmVar1 = g->var;
    if (ppppmVar1 != (mfcc_t ****)0x0) {
      ckd_free(***ppppmVar1);
      ckd_free_3d(ppppmVar1);
    }
    if (g->det != (mfcc_t ***)0x0) {
      ckd_free_3d(g->det);
    }
    if (g->featlen != (int32 *)0x0) {
      ckd_free(g->featlen);
    }
    if (g->lmath != (logmath_t *)0x0) {
      logmath_free(g->lmath);
    }
    ckd_free(g);
    return;
  }
  return;
}

Assistant:

void
gauden_free(gauden_t * g)
{
    if (g == NULL)
        return;
    if (g->mean)
        gauden_param_free(g->mean);
    if (g->var)
        gauden_param_free(g->var);
    if (g->det)
        ckd_free_3d(g->det);
    if (g->featlen)
        ckd_free(g->featlen);
    if (g->lmath)
        logmath_free(g->lmath);
    ckd_free(g);
}